

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadEventSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  uint local_3c;
  uint local_38;
  Index sig_index;
  Index event_index;
  Index i;
  uint local_28;
  Enum local_24;
  Index num_events;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _num_events = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc6])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    i = (Index)ReadCount(this,&local_28,"event count");
    bVar1 = Failed((Result)i);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      event_index = (*this->delegate_->_vptr_BinaryReaderDelegate[199])();
      bVar1 = Succeeded((Result)event_index);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        for (sig_index = 0; sig_index < local_28; sig_index = sig_index + 1) {
          local_38 = this->num_event_imports_ + sig_index;
          RVar2 = ReadEventType(this,&local_3c);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[200])
                                  (this->delegate_,(ulong)local_38,(ulong)local_3c);
          bVar1 = Succeeded(RVar2);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"OnEventType callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc9])();
        bVar1 = Succeeded(RVar2);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndEventSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnEventCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginEventSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadEventSection(Offset section_size) {
  CALLBACK(BeginEventSection, section_size);
  Index num_events;
  CHECK_RESULT(ReadCount(&num_events, "event count"));
  CALLBACK(OnEventCount, num_events);

  for (Index i = 0; i < num_events; ++i) {
    Index event_index = num_event_imports_ + i;
    Index sig_index;
    CHECK_RESULT(ReadEventType(&sig_index));
    CALLBACK(OnEventType, event_index, sig_index);
  }

  CALLBACK(EndEventSection);
  return Result::Ok;
}